

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  const_reference b;
  reference pvVar13;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  bool bVar14;
  Mat *top_blob;
  int op_type_r;
  Mat *B;
  Mat *A;
  bool a_is_lower;
  bool a_size_is_lower;
  bool a_rank_is_lower;
  bool b_is_scalar;
  Option *in_stack_00000238;
  int in_stack_00000244;
  Mat *in_stack_00000248;
  Mat *in_stack_00000250;
  Mat *in_stack_00000258;
  Option *in_stack_ffffffffffffff18;
  int iVar15;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar16;
  const_reference m;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  int local_24;
  
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar10 = pvVar11->w;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar15 = pvVar11->h;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar1 = pvVar11->d;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar2 = pvVar11->c;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  bVar14 = iVar10 * iVar15 * iVar1 * iVar2 * pvVar11->elempack == 1;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar10 = pvVar11->dims;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  bVar9 = pvVar11->dims <= iVar10;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar10 = pvVar11->w;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar15 = pvVar11->h;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar1 = pvVar11->d;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar2 = pvVar11->c;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar3 = pvVar11->elempack;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar4 = pvVar11->w;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar5 = pvVar11->h;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar6 = pvVar11->d;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar7 = pvVar11->c;
  pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  bVar8 = iVar10 * iVar15 * iVar1 * iVar2 * iVar3 <
          iVar4 * iVar5 * iVar6 * iVar7 * pvVar11->elempack;
  if (bVar9 || bVar14) {
    in_stack_ffffffffffffff47 = bVar8;
  }
  if ((bVar9 || bVar14) && !bVar8) {
    pvVar12 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
    m = pvVar12;
    b = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
    iVar10 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    pvVar11 = b;
  }
  else {
    pvVar12 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
    m = pvVar12;
    pvVar11 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
    b = pvVar11;
    iVar10 = get_reverse_op_type(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  }
  pvVar13 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  Mat::create_like((Mat *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),m,
                   (Allocator *)b);
  uVar16 = CONCAT13(1,(int3)in_stack_ffffffffffffff28);
  if (pvVar13->data != (void *)0x0) {
    uVar16 = CONCAT13(pvVar13->cstep * (long)pvVar13->c == 0,(int3)in_stack_ffffffffffffff28);
  }
  if ((char)((uint)uVar16 >> 0x18) == '\0') {
    iVar15 = (int)((ulong)pvVar13 >> 0x20);
    if (pvVar11->w * pvVar11->h * pvVar11->d * pvVar11->c * pvVar11->elempack == 1) {
      local_24 = binary_op_scalar(m,(float)((ulong)b >> 0x20),(Mat *)CONCAT44(iVar10,uVar16),iVar15,
                                  in_stack_ffffffffffffff18);
    }
    else if (((((pvVar12->dims == pvVar11->dims) && (pvVar12->w == pvVar11->w)) &&
              (pvVar12->h == pvVar11->h)) &&
             ((pvVar12->d == pvVar11->d && (pvVar12->c == pvVar11->c)))) &&
            (pvVar12->elempack == pvVar11->elempack)) {
      local_24 = binary_op_no_broadcast
                           (m,b,(Mat *)CONCAT44(iVar10,uVar16),iVar15,in_stack_ffffffffffffff18);
    }
    else if ((((pvVar11->dims < pvVar12->dims) ||
              (((pvVar12->dims == 2 && (pvVar11->w == 1)) && (pvVar11->h == pvVar12->h)))) ||
             ((((pvVar12->dims == 3 && (pvVar11->w == 1)) && (pvVar11->h == 1)) &&
              (pvVar11->c == pvVar12->c)))) ||
            (((((pvVar12->dims == 3 && (pvVar11->w == 1)) &&
               ((pvVar11->h == pvVar12->h && (pvVar11->c == pvVar12->c)))) ||
              (((pvVar12->dims == 4 && (pvVar11->w == 1)) &&
               ((pvVar11->h == 1 && ((pvVar11->d == 1 && (pvVar11->c == pvVar12->c)))))))) ||
             ((((pvVar12->dims == 4 &&
                (((pvVar11->w == 1 && (pvVar11->h == 1)) && (pvVar11->d == pvVar12->d)))) &&
               (pvVar11->c == pvVar12->c)) ||
              (((pvVar12->dims == 4 && (pvVar11->w == 1)) &&
               ((pvVar11->h == pvVar12->h &&
                ((pvVar11->d == pvVar12->d && (pvVar11->c == pvVar12->c)))))))))))) {
      local_24 = binary_op_broadcast_inner
                           (in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000244,
                            in_stack_00000238);
    }
    else if ((pvVar11->elempack == 1) &&
            ((((((((pvVar12->dims == 2 && (pvVar11->w == pvVar12->w)) && (pvVar11->h == 1)) ||
                 (((pvVar12->dims == 3 && (pvVar11->w == pvVar12->w)) &&
                  ((pvVar11->h == 1 && (pvVar11->c == 1)))))) ||
                ((((pvVar12->dims == 3 && (pvVar11->w == pvVar12->w)) && (pvVar11->h == pvVar12->h))
                 && (pvVar11->c == 1)))) ||
               ((((pvVar12->dims == 4 && (pvVar11->w == pvVar12->w)) && (pvVar11->h == 1)) &&
                ((pvVar11->d == 1 && (pvVar11->c == 1)))))) ||
              (((pvVar12->dims == 4 && ((pvVar11->w == pvVar12->w && (pvVar11->h == pvVar12->h))))
               && ((pvVar11->d == 1 && (pvVar11->c == 1)))))) ||
             ((((pvVar12->dims == 4 && (pvVar11->w == pvVar12->w)) && (pvVar11->h == pvVar12->h)) &&
              ((pvVar11->d == pvVar12->d && (pvVar11->c == 1)))))))) {
      local_24 = binary_op_broadcast_outer
                           (m,b,(Mat *)CONCAT44(iVar10,uVar16),iVar15,in_stack_ffffffffffffff18);
    }
    else if ((((pvVar12->dims == 3) && ((pvVar11->dims == 3 && (pvVar12->w == pvVar11->w)))) &&
             (pvVar11->h == 1)) && (pvVar12->c == pvVar11->c)) {
      local_24 = binary_op_broadcast_20
                           (m,b,(Mat *)CONCAT44(iVar10,uVar16),iVar15,in_stack_ffffffffffffff18);
    }
    else {
      local_24 = 0;
    }
  }
  else {
    local_24 = -100;
  }
  return local_24;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c * bottom_blobs[0].elempack < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c * B.elempack == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c && A.elempack == B.elempack)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if (B.elempack == 1 && ((A.dims == 2 && B.w == A.w && B.h == 1) || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1) || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1)))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}